

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O0

bool __thiscall
CLParser::Parse(CLParser *this,string *output,string *deps_prefix,string *filtered_output,
               string *err)

{
  Metrics *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  Metric *local_178;
  string local_150;
  _Base_ptr local_130;
  undefined1 local_128;
  string local_120;
  int local_fc;
  uint64_t local_f8;
  uint64_t slash_bits;
  string normalized;
  string include;
  string line;
  size_t end;
  size_t start;
  ScopedMetric metrics_h_scoped;
  bool local_5a;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *err_local;
  string *filtered_output_local;
  string *deps_prefix_local;
  string *output_local;
  CLParser *this_local;
  
  local_38 = err;
  err_local = filtered_output;
  filtered_output_local = deps_prefix;
  deps_prefix_local = output;
  output_local = (string *)this;
  if ((Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
       ::metrics_h_metric == '\0') &&
     (iVar2 = __cxa_guard_acquire(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                                   ::metrics_h_metric), this_00 = g_metrics, iVar2 != 0)) {
    metrics_h_scoped.start_._3_1_ = 0;
    local_5a = g_metrics == (Metrics *)0x0;
    if (local_5a) {
      local_178 = (Metric *)0x0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"CLParser::Parse",&local_59);
      metrics_h_scoped.start_._3_1_ = 1;
      local_178 = Metrics::NewMetric(this_00,&local_58);
    }
    local_5a = !local_5a;
    if ((metrics_h_scoped.start_._3_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_58);
    }
    if (local_5a) {
      std::allocator<char>::~allocator(&local_59);
    }
    Parse::metrics_h_metric = local_178;
    __cxa_guard_release(&Parse(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,std::__cxx11::string*)
                         ::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric((ScopedMetric *)&start,Parse::metrics_h_metric);
  if (deps_prefix_local == err_local) {
    __assert_fail("&output != filtered_output",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clparser.cc"
                  ,0x52,"bool CLParser::Parse(const string &, const string &, string *, string *)");
  }
  end = 0;
  do {
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= end) {
      this_local._7_1_ = 1;
      local_fc = 1;
      break;
    }
    line.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)deps_prefix_local,0x153f28);
    if (line.field_2._8_8_ == -1) {
      line.field_2._8_8_ = std::__cxx11::string::size();
    }
    std::__cxx11::string::substr((ulong)((long)&include.field_2 + 8),(ulong)deps_prefix_local);
    FilterShowIncludes((string *)((long)&normalized.field_2 + 8),
                       (string *)((long)&include.field_2 + 8),filtered_output_local);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)&slash_bits);
      std::__cxx11::string::operator=
                ((string *)&slash_bits,(string *)(normalized.field_2._M_local_buf + 8));
      bVar1 = CanonicalizePath((string *)&slash_bits,&local_f8,local_38);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_120,(string *)&slash_bits);
        bVar1 = IsSystemInclude(&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&this->includes_,(value_type *)&slash_bits);
          local_130 = (_Base_ptr)pVar5.first._M_node;
          local_128 = pVar5.second;
        }
        local_fc = 0;
      }
      else {
        this_local._7_1_ = 0;
        local_fc = 1;
      }
      std::__cxx11::string::~string((string *)&slash_bits);
      if (local_fc == 0) goto LAB_00127ff4;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_150,(string *)(include.field_2._M_local_buf + 8));
      bVar1 = FilterInputFilename(&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      if (!bVar1) {
        std::__cxx11::string::append((string *)err_local);
        std::__cxx11::string::append((char *)err_local);
      }
LAB_00127ff4:
      uVar3 = std::__cxx11::string::size();
      if (((ulong)line.field_2._8_8_ < uVar3) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)deps_prefix_local),
         *pcVar4 == '\r')) {
        line.field_2._8_8_ = line.field_2._8_8_ + 1;
      }
      uVar3 = std::__cxx11::string::size();
      if (((ulong)line.field_2._8_8_ < uVar3) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)deps_prefix_local),
         *pcVar4 == '\n')) {
        line.field_2._8_8_ = line.field_2._8_8_ + 1;
      }
      end = line.field_2._8_8_;
      local_fc = 0;
    }
    std::__cxx11::string::~string((string *)(normalized.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(include.field_2._M_local_buf + 8));
  } while (local_fc == 0);
  ScopedMetric::~ScopedMetric((ScopedMetric *)&start);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CLParser::Parse(const string& output, const string& deps_prefix,
                     string* filtered_output, string* err) {
  METRIC_RECORD("CLParser::Parse");

  // Loop over all lines in the output to process them.
  assert(&output != filtered_output);
  size_t start = 0;
#ifdef _WIN32
  IncludesNormalize normalizer(".");
#endif

  while (start < output.size()) {
    size_t end = output.find_first_of("\r\n", start);
    if (end == string::npos)
      end = output.size();
    string line = output.substr(start, end - start);

    string include = FilterShowIncludes(line, deps_prefix);
    if (!include.empty()) {
      string normalized;
#ifdef _WIN32
      if (!normalizer.Normalize(include, &normalized, err))
        return false;
#else
      // TODO: should this make the path relative to cwd?
      normalized = include;
      uint64_t slash_bits;
      if (!CanonicalizePath(&normalized, &slash_bits, err))
        return false;
#endif
      if (!IsSystemInclude(normalized))
        includes_.insert(normalized);
    } else if (FilterInputFilename(line)) {
      // Drop it.
      // TODO: if we support compiling multiple output files in a single
      // cl.exe invocation, we should stash the filename.
    } else {
      filtered_output->append(line);
      filtered_output->append("\n");
    }

    if (end < output.size() && output[end] == '\r')
      ++end;
    if (end < output.size() && output[end] == '\n')
      ++end;
    start = end;
  }

  return true;
}